

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::FixupFirstLefts1(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  _func_int **pp_Var1;
  long lVar2;
  bool bVar3;
  OutRec *pOVar4;
  size_type i;
  ulong uVar5;
  
  pp_Var1 = this->_vptr_Clipper;
  for (uVar5 = 0; lVar2 = *(long *)((long)&this->m_ClipType + (long)pp_Var1[-3]),
      uVar5 < (ulong)(*(long *)(pp_Var1[-3] +
                               (long)&(this->m_Maxima).
                                      super__List_base<long_long,_std::allocator<long_long>_>) -
                      lVar2 >> 3); uVar5 = uVar5 + 1) {
    lVar2 = *(long *)(lVar2 + uVar5 * 8);
    pOVar4 = ParseFirstLeft(*(OutRec **)(lVar2 + 8));
    if (pOVar4 == OldOutRec && *(OutPt **)(lVar2 + 0x18) != (OutPt *)0x0) {
      bVar3 = Poly2ContainsPoly1(*(OutPt **)(lVar2 + 0x18),NewOutRec->Pts);
      if (bVar3) {
        *(OutRec **)(lVar2 + 8) = NewOutRec;
      }
    }
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts1(OutRec* OldOutRec, OutRec* NewOutRec)
{ 
  //tests if NewOutRec contains the polygon before reassigning FirstLeft
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts  && firstLeft == OldOutRec)
    {
      if (Poly2ContainsPoly1(outRec->Pts, NewOutRec->Pts))
        outRec->FirstLeft = NewOutRec;
    }
  }
}